

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_protobuf.h
# Opt level: O3

bool __thiscall
ec::base_protobuf::get_varint<unsigned_int,void>
          (base_protobuf *this,uint8_t **pd,int *len,uint *out)

{
  int iVar1;
  byte *pbVar2;
  uint uVar3;
  byte *pbVar4;
  bool bVar5;
  
  uVar3 = 0;
  if (0 < *len) {
    *out = 0;
    pbVar2 = *pd;
    do {
      pbVar4 = pbVar2 + 1;
      *out = *out | (*pbVar2 & 0x7f) << ((byte)uVar3 & 0x1f);
      if (-1 < (char)*pbVar2) {
        *pd = pbVar4;
        *len = *len + -1;
        uVar3 = 1;
        goto LAB_0010e1bc;
      }
      *pd = pbVar4;
      iVar1 = *len;
      *len = iVar1 + -1;
    } while ((1 < iVar1) && (bVar5 = uVar3 < 0x19, pbVar2 = pbVar4, uVar3 = uVar3 + 7, bVar5));
    this->_lasterr = 2;
    uVar3 = 0;
  }
LAB_0010e1bc:
  return SUB41(uVar3,0);
}

Assistant:

bool get_varint(const uint8_t *&pd, int &len, _Tp &out) //get Varint (Base 128 Varints)
    {
        if (len <= 0) {
            return false;
        }

        int nbit = 0;
        out = 0;

        do {
            out |= (*pd & (_Tp)0x7F) << nbit;

            if (!(*pd & 0x80)) {
                pd++;
                len--;
                return true;
            }

            nbit += 7;
            pd++;
            len--;
        } while (len > 0 && nbit < ((int)sizeof(_Tp) * 8));

        _lasterr = pberr_decode;
        return false;
    }